

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

vec3 dja::rotate(vec3 *r,vec3 *axis,float_t rad)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  vec3 vVar10;
  
  fVar4 = cosf(rad);
  fVar5 = sinf(rad);
  fVar1 = axis->x;
  fVar2 = axis->y;
  fVar3 = axis->z;
  fVar9 = r->z * fVar3 + r->x * fVar1 + r->y * fVar2;
  fVar6 = r->x - fVar1 * fVar9;
  fVar8 = r->y - fVar2 * fVar9;
  fVar7 = r->z - fVar9 * fVar3;
  vVar10.x = (fVar6 * fVar4 - (fVar8 * fVar3 - fVar2 * fVar7) * fVar5) + fVar1 * fVar9;
  vVar10.y = (fVar8 * fVar4 - (fVar7 * fVar1 - fVar3 * fVar6) * fVar5) + fVar2 * fVar9;
  vVar10.z = (fVar7 * fVar4 - (fVar6 * fVar2 - fVar1 * fVar8) * fVar5) + fVar9 * fVar3;
  return vVar10;
}

Assistant:

V3 rotate(const V3& r, const V3& axis, const V1 rad) {
    V1 c = cos(rad), s = sin(rad);
    V3 r1 = axis * dot(r, axis);
    V3 r2 = r - r1;
    V3 r3 = cross(r2, axis);

    return c * r2 - s * r3 + r1;
}